

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O2

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," --in in_file [--out out_file] [--key key [--val val]?]+\n");
  poVar1 = std::operator<<(poVar1,"Modifies/Adds/Removes PDF /Info entries in the in_file\n");
  poVar1 = std::operator<<(poVar1,"and stores the result in out_file\n");
  poVar1 = std::operator<<(poVar1,"Special mode: ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," --dump file\n");
  std::operator<<(poVar1,"dumps all /Info entries to stdout\n");
  exit(2);
}

Assistant:

void
usage()
{
    std::cerr << "Usage: " << whoami << " --in in_file [--out out_file] [--key key [--val val]?]+\n"
              << "Modifies/Adds/Removes PDF /Info entries in the in_file\n"
              << "and stores the result in out_file\n"
              << "Special mode: " << whoami << " --dump file\n"
              << "dumps all /Info entries to stdout\n";
    exit(2);
}